

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  _Bool _Var1;
  roaring_array_t *prVar2;
  container_t *pcVar3;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2_1;
  container_t *c1_1;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint16_t s2;
  uint16_t s1;
  uint8_t type2;
  uint8_t type1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  int length2;
  int length1;
  uint8_t result_type;
  container_t *in_stack_ffffffffffffff48;
  uint8_t typecode;
  container_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar4;
  undefined2 in_stack_ffffffffffffff5c;
  undefined2 uVar5;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar7;
  roaring_array_t *in_stack_ffffffffffffff60;
  roaring_bitmap_t *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  container_t *in_stack_ffffffffffffff78;
  _Bool local_69;
  ushort local_3e;
  ushort local_3c;
  uint8_t local_3a;
  uint8_t local_39;
  int local_38;
  int local_34;
  roaring_array_t *local_30;
  int local_24;
  int local_20;
  undefined1 local_19;
  roaring_array_t *local_18;
  roaring_array_t *local_10;
  roaring_array_t *local_8;
  
  local_19 = 0;
  local_20 = ((roaring_array_t *)&in_RDI->size)->size;
  local_24 = ((roaring_array_t *)&in_RSI->size)->size;
  if (local_20 == 0) {
    local_8 = &roaring_bitmap_copy(in_stack_ffffffffffffff68)->high_low_container;
  }
  else if (local_24 == 0) {
    local_8 = &roaring_bitmap_copy(in_stack_ffffffffffffff68)->high_low_container;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    prVar2 = &roaring_bitmap_create_with_capacity
                        (CONCAT13(in_stack_ffffffffffffff5f,
                                  CONCAT12(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff5c)))->
              high_low_container;
    local_30 = prVar2;
    _Var1 = is_cow((roaring_bitmap_t *)local_10);
    local_69 = true;
    if (!_Var1) {
      local_69 = is_cow((roaring_bitmap_t *)local_18);
    }
    roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)prVar2,local_69);
    local_34 = 0;
    local_38 = 0;
    local_3c = ra_get_key_at_index(local_10,0);
    local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
    while( true ) {
      while (local_3c != local_3e) {
        if (local_3c < local_3e) {
          ra_get_container_at_index(local_10,(uint16_t)local_34,&local_39);
          is_cow((roaring_bitmap_t *)local_10);
          pcVar3 = get_copy_of_container
                             (in_stack_ffffffffffffff68,(uint8_t *)in_stack_ffffffffffffff60,
                              (_Bool)in_stack_ffffffffffffff5f);
          _Var1 = is_cow((roaring_bitmap_t *)local_10);
          if (_Var1) {
            ra_set_container_at_index(local_10,local_34,pcVar3,local_39);
          }
          ra_append(in_stack_ffffffffffffff60,
                    CONCAT11(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e),
                    in_stack_ffffffffffffff50,(uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38));
          local_34 = local_34 + 1;
          if (local_34 == local_20) goto LAB_00107f16;
          local_3c = ra_get_key_at_index(local_10,(uint16_t)local_34);
        }
        else {
          in_stack_ffffffffffffff78 =
               ra_get_container_at_index(local_18,(uint16_t)local_38,&local_3a);
          is_cow((roaring_bitmap_t *)local_18);
          pcVar3 = get_copy_of_container
                             (in_stack_ffffffffffffff68,(uint8_t *)in_stack_ffffffffffffff60,
                              (_Bool)in_stack_ffffffffffffff5f);
          _Var1 = is_cow((roaring_bitmap_t *)local_18);
          if (_Var1) {
            ra_set_container_at_index(local_18,local_38,pcVar3,local_3a);
          }
          ra_append(in_stack_ffffffffffffff60,
                    CONCAT11(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e),
                    in_stack_ffffffffffffff50,(uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38));
          local_38 = local_38 + 1;
          if (local_38 == local_24) goto LAB_00107f16;
          local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
        }
      }
      ra_get_container_at_index(local_10,(uint16_t)local_34,&local_39);
      ra_get_container_at_index(local_18,(uint16_t)local_38,&local_3a);
      container_xor(in_stack_ffffffffffffff78,(uint8_t)((uint)in_stack_ffffffffffffff74 >> 0x18),
                    in_stack_ffffffffffffff68,(uint8_t)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                    (uint8_t *)
                    CONCAT17(in_stack_ffffffffffffff5f,
                             CONCAT16(in_stack_ffffffffffffff5e,
                                      CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))
                            ));
      _Var1 = container_nonzero_cardinality(in_stack_ffffffffffffff48,'\0');
      typecode = (uint8_t)((ulong)in_stack_ffffffffffffff48 >> 0x38);
      if (_Var1) {
        ra_append(in_stack_ffffffffffffff60,
                  CONCAT11(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff5e),
                  in_stack_ffffffffffffff50,typecode);
      }
      else {
        container_free(in_stack_ffffffffffffff50,typecode);
      }
      local_34 = local_34 + 1;
      local_38 = local_38 + 1;
      if ((local_34 == local_20) || (local_38 == local_24)) break;
      local_3c = ra_get_key_at_index(local_10,(uint16_t)local_34);
      local_3e = ra_get_key_at_index(local_18,(uint16_t)local_38);
    }
LAB_00107f16:
    uVar6 = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
    if (local_34 == local_20) {
      prVar2 = local_30;
      is_cow((roaring_bitmap_t *)local_18);
      ra_append_copy_range
                (prVar2,(roaring_array_t *)
                        CONCAT17(in_stack_ffffffffffffff5f,
                                 CONCAT16(in_stack_ffffffffffffff5e,
                                          CONCAT24(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58))),
                 (int32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                 (int32_t)in_stack_ffffffffffffff50,(_Bool)uVar6);
    }
    else if (local_38 == local_24) {
      uVar5 = (undefined2)local_20;
      uVar6 = (undefined1)((uint)local_20 >> 0x10);
      uVar7 = (undefined1)((uint)local_20 >> 0x18);
      prVar2 = local_30;
      iVar4 = local_34;
      is_cow((roaring_bitmap_t *)local_10);
      ra_append_copy_range
                (in_stack_ffffffffffffff60,
                 (roaring_array_t *)CONCAT17(uVar7,CONCAT16(uVar6,CONCAT24(uVar5,iVar4))),
                 (int32_t)((ulong)local_10 >> 0x20),(int32_t)local_10,SUB81((ulong)prVar2 >> 0x38,0)
                );
    }
    local_8 = local_30;
  }
  return (roaring_bitmap_t *)local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}